

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

string * format(string *__return_storage_ptr__,string *fmt,int arg1)

{
  string local_78;
  allocator<char> local_41;
  string local_40;
  undefined1 local_1d;
  int local_1c;
  string *psStack_18;
  int arg1_local;
  string *fmt_local;
  string *output;
  
  local_1d = 0;
  local_1c = arg1;
  psStack_18 = fmt;
  fmt_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"{1}",&local_41);
  format_abi_cxx11_(&local_78,local_1c);
  replace_positional(__return_storage_ptr__,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (
  const std::string& fmt,
  int arg1)
{
  std::string output = fmt;
  replace_positional (output, "{1}", format (arg1));
  return output;
}